

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbc.c
# Opt level: O0

void Wlc_NtkPrintInputInfo(Wlc_Ntk_t *pNtk)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  Wlc_Obj_t *pWVar6;
  char *pcVar7;
  uint local_74;
  uint local_50;
  int index_1;
  char c;
  int index;
  FILE *output;
  int nBits;
  int nEnd;
  int nBeg;
  int nRange;
  int k;
  int i;
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *pNtk_local;
  
  output._0_4_ = 0;
  __stream = fopen("abc_blast_input.info","w");
  for (nRange = 0; iVar3 = Wlc_NtkCiNum(pNtk), nRange < iVar3; nRange = nRange + 1) {
    pWVar6 = Wlc_NtkCi(pNtk,nRange);
    iVar4 = Wlc_ObjRange(pWVar6);
    iVar3 = pWVar6->Beg;
    iVar2 = pWVar6->End;
    for (nBeg = 0; nBeg < iVar4; nBeg = nBeg + 1) {
      iVar5 = iVar2;
      if (iVar3 < iVar2) {
        iVar5 = iVar3;
      }
      local_50 = iVar5 + nBeg;
      if ((undefined1  [24])((undefined1  [24])*pWVar6 & (undefined1  [24])0x3f) ==
          (undefined1  [24])0x3) {
        cVar1 = pNtk->pInits[(int)output + nBeg];
      }
      else {
        cVar1 = 'i';
      }
      iVar5 = Wlc_ObjId(pNtk,pWVar6);
      pcVar7 = Wlc_ObjName(pNtk,iVar5);
      fprintf(__stream,"%s[%d] : %c \n",pcVar7,(ulong)local_50,(ulong)(uint)(int)cVar1);
    }
    if ((undefined1  [24])((undefined1  [24])*pWVar6 & (undefined1  [24])0x3f) ==
        (undefined1  [24])0x3) {
      output._0_4_ = iVar4 + (int)output;
    }
  }
  for (nRange = 0; iVar3 = Wlc_NtkPoNum(pNtk), nRange < iVar3; nRange = nRange + 1) {
    pWVar6 = Wlc_NtkPo(pNtk,nRange);
    iVar4 = Wlc_ObjRange(pWVar6);
    iVar3 = pWVar6->Beg;
    iVar2 = pWVar6->End;
    for (nBeg = 0; nBeg < iVar4; nBeg = nBeg + 1) {
      iVar5 = iVar2;
      if (iVar3 < iVar2) {
        iVar5 = iVar3;
      }
      local_74 = iVar5 + nBeg;
      iVar5 = Wlc_ObjId(pNtk,pWVar6);
      pcVar7 = Wlc_ObjName(pNtk,iVar5);
      fprintf(__stream,"%s[%d] : o \n",pcVar7,(ulong)local_74);
    }
  }
  fclose(__stream);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []

  SideEffects []

  SeeAlso     []

***********************************************************************/
void Wlc_NtkPrintInputInfo( Wlc_Ntk_t * pNtk )
{
    Wlc_Obj_t * pObj;
    int i, k, nRange, nBeg, nEnd, nBits = 0;
    FILE * output;

    output = fopen("abc_blast_input.info","w");

    Wlc_NtkForEachCi( pNtk, pObj, i )
    {
        nRange = Wlc_ObjRange(pObj);
        nBeg = pObj->Beg;
        nEnd = pObj->End;

        for ( k = 0; k < nRange; k++ )
        {
            int index = nEnd > nBeg ? nBeg + k : nEnd + k;
            char c = pObj->Type != WLC_OBJ_FO ? 'i' : pNtk->pInits[nBits + k];
            fprintf(output,"%s[%d] : %c \n", Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), index , c );
        }
        if (pObj->Type == WLC_OBJ_FO)
            nBits += nRange;
    }

    Wlc_NtkForEachPo( pNtk, pObj, i )
    {
        nRange = Wlc_ObjRange(pObj);
        nBeg = pObj->Beg;
        nEnd = pObj->End;

        for ( k = 0; k < nRange; k++ )
        {
            int index = nEnd > nBeg ? nBeg + k : nEnd + k;
            fprintf(output,"%s[%d] : o \n", Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), index);
        }
    }

    fclose(output);
    return;
}